

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int16_To_Int8(void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride
                  ,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  undefined1 *local_40;
  char *dest;
  PaInt16 *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  local_40 = (undefined1 *)destinationBuffer;
  dest = (char *)sourceBuffer;
  ditherGenerator_local._0_4_ = count;
  while ((uint)ditherGenerator_local != 0) {
    *local_40 = (char)((ushort)*(undefined2 *)dest >> 8);
    dest = dest + (long)sourceStride * 2;
    local_40 = local_40 + destinationStride;
    ditherGenerator_local._0_4_ = (uint)ditherGenerator_local - 1;
  }
  return;
}

Assistant:

static void Int16_To_Int8(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    PaInt16 *src = (PaInt16*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        (*dest) = (signed char)((*src) >> 8);

        src += sourceStride;
        dest += destinationStride;
    }
}